

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O1

JSONValue * JSON::Parse(wchar_t *data)

{
  wchar_t *pwVar1;
  ulong uVar2;
  JSONValue *this;
  wchar_t *local_18;
  
  for (; uVar2 = (ulong)(uint)*data, uVar2 < 0x21; data = data + 1) {
    if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0) {
        return (JSONValue *)0x0;
      }
      break;
    }
  }
  local_18 = data;
  this = JSONValue::Parse(&local_18);
  pwVar1 = local_18;
  if (this != (JSONValue *)0x0) {
    do {
      local_18 = pwVar1;
      uVar2 = (ulong)(uint)*local_18;
      if (0x20 < uVar2) goto LAB_00172209;
      pwVar1 = local_18 + 1;
    } while ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0);
    if (uVar2 == 0) {
      return this;
    }
LAB_00172209:
    JSONValue::~JSONValue(this);
    operator_delete(this);
  }
  return (JSONValue *)0x0;
}

Assistant:

JSONValue *JSON::Parse(const wchar_t *data)
{
	// Skip any preceding whitespace, end of data = no JSON = fail
	if (!SkipWhitespace(&data))
		return NULL;

	// We need the start of a value here now...
	JSONValue *value = JSONValue::Parse(&data);
	if (value == NULL)
		return NULL;
	
	// Can be white space now and should be at the end of the string then...
	if (SkipWhitespace(&data))
	{
		delete value;
		return NULL;
	}
	
	// We're now at the end of the string
	return value;
}